

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  int rc;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = pagerLockDb((Pager *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffec);
  if (iVar1 != 0) {
    pagerUnlockDb((Pager *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return iVar1;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */

  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the 
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, SHARED_LOCK);
  }

  return rc;
}